

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::Predictor(IPM *this,Step *step)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  Vector *pVVar5;
  valarray<double> *in_RSI;
  long in_RDI;
  Int j_1;
  Vector su;
  Int j;
  Vector sl;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  Model *model;
  double *in_stack_00000298;
  double *in_stack_000002a0;
  double *in_stack_000002a8;
  double *in_stack_000002b0;
  double *in_stack_000002b8;
  IPM *in_stack_000002c0;
  double *in_stack_000002d0;
  Step *in_stack_000002d8;
  size_t in_stack_fffffffffffffea8;
  Iterate *in_stack_fffffffffffffeb0;
  int local_7c;
  valarray<double> local_78 [2];
  int local_54;
  valarray<double> local_50;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Vector *local_28;
  Int local_20;
  Int local_1c;
  Model *local_18;
  valarray<double> *local_10;
  
  local_10 = in_RSI;
  local_18 = Iterate::model(*(Iterate **)(in_RDI + 0x10));
  local_1c = Model::rows(local_18);
  local_20 = Model::cols(local_18);
  local_28 = Iterate::xl(*(Iterate **)(in_RDI + 0x10));
  local_30 = Iterate::xu(*(Iterate **)(in_RDI + 0x10));
  local_38 = Iterate::zl(*(Iterate **)(in_RDI + 0x10));
  local_40 = Iterate::zu(*(Iterate **)(in_RDI + 0x10));
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  for (local_54 = 0; local_54 < local_20 + local_1c; local_54 = local_54 + 1) {
    bVar3 = Iterate::has_barrier_lb
                      (in_stack_fffffffffffffeb0,(Int)(in_stack_fffffffffffffea8 >> 0x20));
    if (bVar3) {
      pdVar4 = std::valarray<double>::operator[](local_28,(long)local_54);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_54);
      dVar2 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](&local_50,(long)local_54);
      *pdVar4 = -dVar1 * dVar2;
    }
    else {
      pdVar4 = std::valarray<double>::operator[](&local_50,(long)local_54);
      *pdVar4 = 0.0;
    }
  }
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  for (local_7c = 0; local_7c < local_20 + local_1c; local_7c = local_7c + 1) {
    bVar3 = Iterate::has_barrier_ub
                      (in_stack_fffffffffffffeb0,(Int)(in_stack_fffffffffffffea8 >> 0x20));
    if (bVar3) {
      pdVar4 = std::valarray<double>::operator[](local_30,(long)local_7c);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_40,(long)local_7c);
      dVar2 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_78,(long)local_7c);
      *pdVar4 = -dVar1 * dVar2;
    }
    else {
      pdVar4 = std::valarray<double>::operator[](local_78,(long)local_7c);
      *pdVar4 = 0.0;
    }
  }
  pVVar5 = Iterate::rb(in_stack_fffffffffffffeb0);
  std::valarray<double>::operator[](pVVar5,0);
  pVVar5 = Iterate::rc(in_stack_fffffffffffffeb0);
  std::valarray<double>::operator[](pVVar5,0);
  pVVar5 = Iterate::rl(in_stack_fffffffffffffeb0);
  std::valarray<double>::operator[](pVVar5,0);
  pVVar5 = Iterate::ru(in_stack_fffffffffffffeb0);
  std::valarray<double>::operator[](pVVar5,0);
  std::valarray<double>::operator[](&local_50,0);
  std::valarray<double>::operator[](local_78,0);
  SolveNewtonSystem(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
                    in_stack_000002a0,in_stack_00000298,in_stack_000002d0,in_stack_000002d8);
  std::valarray<double>::~valarray(local_10);
  std::valarray<double>::~valarray(local_10);
  return;
}

Assistant:

void IPM::Predictor(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();

    // sl = -xl.*zl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}